

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtensionDeclarationMissingBothNameAndType_Test::TestBody
          (CommandLineInterfaceTest_ExtensionDeclarationMissingBothNameAndType_Test *this)

{
  string_view name;
  string_view expected_substring;
  string_view contents;
  allocator<char> local_31;
  string local_30;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    syntax = \"proto2\";\n    package foo;\n    message Foo {\n      extensions 4000 to max [\n        declaration = {\n          number: 6000\n        }];\n    }"
  ;
  contents._M_len = 0x9a;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto",&local_31);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  expected_substring._M_str =
       "Extension declaration #6000 should have both \"full_name\" and \"type\" set";
  expected_substring._M_len = 0x47;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ExtensionDeclarationMissingBothNameAndType) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      extensions 4000 to max [
        declaration = {
          number: 6000
        }];
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Extension declaration #6000 should have both \"full_name\" and \"type\" "
      "set");
}